

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutablePriorityQueue.h
# Opt level: O2

int __thiscall
CMU462::MutablePriorityQueue<CMU462::EdgeRecord>::remove
          (MutablePriorityQueue<CMU462::EdgeRecord> *this,char *__filename)

{
  iterator iVar1;
  size_type sVar2;
  
  iVar1 = std::
          _Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
          ::find((_Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
                  *)this,(key_type *)__filename);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->queue)._M_t._M_impl.super__Rb_tree_header) {
    sVar2 = std::
            _Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
            ::erase((_Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
                     *)this,(key_type *)__filename);
    return (int)sVar2;
  }
  return (int)iVar1._M_node;
}

Assistant:

void remove(const T& item) {
    if (queue.find(item) != queue.end()) {
      queue.erase(item);
    }
  }